

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall BasicBlock::CleanUpValueMaps(BasicBlock *this)

{
  JitArenaAllocator *allocator;
  ValueHashTable<Sym_*,_Value_*> *this_00;
  BVSparse<Memory::JitArenaAllocator> *obj;
  BVSparse<Memory::JitArenaAllocator> *obj_00;
  Value *pVVar1;
  ExprHashTable *pEVar2;
  code *pcVar3;
  Opnd **this_01;
  bool bVar4;
  BOOLEAN BVar5;
  ValueNumber VVar6;
  ValueNumber VVar7;
  SymID key;
  undefined4 *puVar8;
  Type_conflict node;
  Type *ppOVar9;
  Type *pTVar10;
  ValueInfo *pVVar11;
  Sym *pSVar12;
  StackSym *pSVar13;
  Sym *pSVar14;
  Value *this_02;
  bool bVar15;
  Iterator IVar16;
  uint local_21c;
  undefined1 local_210 [8];
  BVSparse<Memory::JitArenaAllocator> tempBv;
  Sym *sym_2;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex dead_id;
  Value *symStoreVal;
  Sym *symStore_2;
  Value *val_2;
  bool removeCurrent;
  ValueNumber src2ValNum;
  ValueNumber src1ValNum;
  ExprHash hash;
  ExprHashBucket *bucket_1;
  EditingIterator iter_1;
  uint i_1;
  bool oldHasCSECandidatesValue;
  ExprHashTable *thisExprTable;
  Sym *symStore_1;
  ValueInfo *valueInfo_1;
  Value *val_1;
  Sym *symStore;
  ValueInfo *valueInfo;
  Value *val;
  bool isSymFieldPRESymStore;
  bool isSymUpwardExposed;
  Sym *sym_1;
  GlobHashBucket *bucket;
  EditingIterator iter;
  uint i;
  StackSym *sym;
  Opnd **opnd;
  Iterator __iter;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *callSequence;
  BVSparse<Memory::JitArenaAllocator> symsInCallSequence;
  bool isInLoop;
  BVSparse<Memory::JitArenaAllocator> *upwardExposedFields;
  BVSparse<Memory::JitArenaAllocator> *upwardExposedUses;
  BVSparse<Memory::JitArenaAllocator> availableValueNumbers;
  undefined1 local_78 [8];
  BVSparse<Memory::JitArenaAllocator> keepAliveSymsBv;
  BVSparse<Memory::JitArenaAllocator> deadSymsBv;
  GlobHashTable *thisTable;
  JitArenaAllocator *tempAlloc;
  uint cleanupCount;
  BasicBlock *this_local;
  
  bVar4 = GlobOpt::GetIsAsmJSFunc((this->globOptData).globOpt);
  if (bVar4) {
    local_21c = DAT_01ea9f38;
  }
  else {
    local_21c = DAT_01ea9f34;
  }
  bVar4 = IsLandingPad(this);
  if ((bVar4) || (local_21c <= ((this->globOptData).globOpt)->instrCountSinceLastCleanUp)) {
    ((this->globOptData).globOpt)->instrCountSinceLastCleanUp = 0;
    allocator = ((this->globOptData).globOpt)->tempAlloc;
    this_00 = (this->globOptData).symToValueMap;
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)&keepAliveSymsBv.lastUsedNodePrevNextField,
               allocator);
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)local_78,allocator);
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)&upwardExposedUses,allocator);
    BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
              ((BVSparse<Memory::JitArenaAllocator> *)&upwardExposedUses,
               ((this->globOptData).globOpt)->byteCodeConstantValueNumbersBv);
    obj = this->upwardExposedUses;
    obj_00 = this->upwardExposedFields;
    symsInCallSequence.lastUsedNodePrevNextField._7_1_ = this->loop != (Loop *)0x0;
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)&callSequence,allocator);
    __iter.current =
         &((this->globOptData).callSequence)->super_SListNodeBase<Memory::ArenaAllocator>;
    if (((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)__iter.current !=
         (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
       (bVar4 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Empty
                          ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
                           __iter.current), !bVar4)) {
      IVar16 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::GetIterator
                         ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)__iter.current
                         );
      while( true ) {
        __iter.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)IVar16.current;
        opnd = (Opnd **)IVar16.list;
        if (__iter.list == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          IVar16.current = &(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>;
          IVar16.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)opnd;
          *puVar8 = 0;
        }
        __iter.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)IVar16.current;
        opnd = (Opnd **)IVar16.list;
        this_01 = opnd;
        node = SListNodeBase<Memory::ArenaAllocator>::Next
                         ((SListNodeBase<Memory::ArenaAllocator> *)__iter.list);
        bVar4 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)this_01,node)
        ;
        if (bVar4) break;
        __iter.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
                      SListNodeBase<Memory::ArenaAllocator>::Next
                                (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        ppOVar9 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)&opnd);
        pSVar13 = IR::Opnd::GetStackSym(*ppOVar9);
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((BVSparse<Memory::JitArenaAllocator> *)&callSequence,(pSVar13->super_Sym).m_id);
        IVar16.current = &(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>;
        IVar16.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)opnd;
      }
      __iter.list = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    }
    for (iter.last._4_4_ = 0; iter.last._4_4_ < this_00->tableSize;
        iter.last._4_4_ = iter.last._4_4_ + 1) {
      SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
                ((EditingIterator *)&bucket,this_00->table + iter.last._4_4_);
      while (bVar4 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                     EditingIterator::Next((EditingIterator *)&bucket), bVar4) {
        pTVar10 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
                  ::Data((Iterator *)&bucket);
        pSVar14 = pTVar10->value;
        BVar5 = BVSparse<Memory::JitArenaAllocator>::Test(obj,pSVar14->m_id);
        bVar4 = true;
        if (BVar5 == '\0') {
          BVar5 = BVSparse<Memory::JitArenaAllocator>::Test(obj_00,pSVar14->m_id);
          bVar4 = BVar5 != '\0';
        }
        if ((bVar4) ||
           (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                              ((BVSparse<Memory::JitArenaAllocator> *)&callSequence,pSVar14->m_id),
           BVar5 == '\0')) {
          bVar15 = false;
          if ((symsInCallSequence.lastUsedNodePrevNextField._7_1_ & 1) != 0) {
            BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                              (this->loop->fieldPRESymStores,pSVar14->m_id);
            bVar15 = BVar5 != '\0';
          }
          if ((((((this->globOptData).globOpt)->maxInitialSymID < pSVar14->m_id) || (bVar4)) ||
              (bVar15)) ||
             (((symsInCallSequence.lastUsedNodePrevNextField._7_1_ & 1) != 0 &&
              (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                                 (((this->globOptData).globOpt)->prePassCopyPropSym,pSVar14->m_id),
              BVar5 != '\0')))) {
            bVar4 = Sym::IsPropertySym(pSVar14);
            if ((bVar4) &&
               (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                                  ((this->globOptData).liveFields,pSVar14->m_id), BVar5 == '\0')) {
              SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
              EditingIterator::RemoveCurrent
                        ((EditingIterator *)&bucket,&this_00->alloc->super_ArenaAllocator);
              BVSparse<Memory::JitArenaAllocator>::Clear
                        ((this->globOptData).liveInt32Syms,pSVar14->m_id);
              BVSparse<Memory::JitArenaAllocator>::Clear
                        ((this->globOptData).liveLossyInt32Syms,pSVar14->m_id);
              BVSparse<Memory::JitArenaAllocator>::Clear
                        ((this->globOptData).liveFloat64Syms,pSVar14->m_id);
            }
            else {
              pVVar1 = pTVar10->element;
              pVVar11 = ::Value::GetValueInfo(pVVar1);
              pSVar12 = ValueInfo::GetSymStore(pVVar11);
              if ((pSVar12 != (Sym *)0x0) && (pSVar12 != pSVar14)) {
                BVSparse<Memory::JitArenaAllocator>::Set
                          ((BVSparse<Memory::JitArenaAllocator> *)local_78,pSVar12->m_id);
                bVar4 = Sym::IsStackSym(pSVar12);
                if (bVar4) {
                  pSVar13 = Sym::AsStackSym(pSVar12);
                  bVar4 = StackSym::HasObjectTypeSym(pSVar13);
                  if (bVar4) {
                    pSVar13 = Sym::AsStackSym(pSVar12);
                    pSVar13 = StackSym::GetObjectTypeSym(pSVar13);
                    BVSparse<Memory::JitArenaAllocator>::Set
                              ((BVSparse<Memory::JitArenaAllocator> *)local_78,
                               (pSVar13->super_Sym).m_id);
                  }
                }
              }
              VVar6 = ::Value::GetValueNumber(pVVar1);
              BVSparse<Memory::JitArenaAllocator>::Set
                        ((BVSparse<Memory::JitArenaAllocator> *)&upwardExposedUses,VVar6);
            }
          }
          else {
            pVVar1 = pTVar10->element;
            pVVar11 = ::Value::GetValueInfo(pVVar1);
            pSVar12 = ValueInfo::GetSymStore(pVVar11);
            if ((pSVar12 == (Sym *)0x0) || (pSVar12 != pSVar14)) {
              bVar4 = Sym::IsStackSym(pSVar14);
              if (bVar4) {
                pSVar13 = Sym::AsStackSym(pSVar14);
                bVar4 = StackSym::HasObjectTypeSym(pSVar13);
                if (bVar4) {
                  pSVar13 = Sym::AsStackSym(pSVar14);
                  pSVar13 = StackSym::GetObjectTypeSym(pSVar13);
                  BVSparse<Memory::JitArenaAllocator>::Set
                            ((BVSparse<Memory::JitArenaAllocator> *)
                             &keepAliveSymsBv.lastUsedNodePrevNextField,(pSVar13->super_Sym).m_id);
                }
              }
              SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
              EditingIterator::RemoveCurrent
                        ((EditingIterator *)&bucket,&this_00->alloc->super_ArenaAllocator);
              BVSparse<Memory::JitArenaAllocator>::Clear
                        ((this->globOptData).liveInt32Syms,pSVar14->m_id);
              BVSparse<Memory::JitArenaAllocator>::Clear
                        ((this->globOptData).liveLossyInt32Syms,pSVar14->m_id);
              BVSparse<Memory::JitArenaAllocator>::Clear
                        ((this->globOptData).liveFloat64Syms,pSVar14->m_id);
              GlobOptBlockData::SetChangedSym(&this->globOptData,pSVar14);
            }
            else {
              pVVar11 = ::Value::GetValueInfo(pTVar10->element);
              bVar4 = ValueInfo::IsVarConstant(pVVar11);
              if (!bVar4) {
                pVVar11 = ::Value::GetValueInfo(pTVar10->element);
                bVar4 = ValueInfo::HasIntConstantValue(pVVar11,false);
                if (!bVar4) {
                  BVSparse<Memory::JitArenaAllocator>::Set
                            ((BVSparse<Memory::JitArenaAllocator> *)
                             &keepAliveSymsBv.lastUsedNodePrevNextField,pSVar14->m_id);
                  bVar4 = Sym::IsStackSym(pSVar14);
                  if (bVar4) {
                    pSVar13 = Sym::AsStackSym(pSVar14);
                    bVar4 = StackSym::HasObjectTypeSym(pSVar13);
                    if (bVar4) {
                      pSVar13 = Sym::AsStackSym(pSVar14);
                      pSVar13 = StackSym::GetObjectTypeSym(pSVar13);
                      BVSparse<Memory::JitArenaAllocator>::Set
                                ((BVSparse<Memory::JitArenaAllocator> *)
                                 &keepAliveSymsBv.lastUsedNodePrevNextField,
                                 (pSVar13->super_Sym).m_id);
                    }
                  }
                }
              }
              VVar6 = ::Value::GetValueNumber(pVVar1);
              BVSparse<Memory::JitArenaAllocator>::Set
                        ((BVSparse<Memory::JitArenaAllocator> *)&upwardExposedUses,VVar6);
            }
          }
        }
      }
    }
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)&keepAliveSymsBv.lastUsedNodePrevNextField,
               (BVSparse<Memory::JitArenaAllocator> *)local_78);
    pEVar2 = (this->globOptData).exprToValueMap;
    iter_1.last._7_1_ = (this->globOptData).hasCSECandidates & 1;
    (this->globOptData).hasCSECandidates = false;
    for (iter_1.last._0_4_ = 0; (uint)iter_1.last < pEVar2->tableSize;
        iter_1.last._0_4_ = (uint)iter_1.last + 1) {
      SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
      GetEditingIterator((EditingIterator *)&bucket_1,pEVar2->table + (uint)iter_1.last);
      while (bVar4 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                     EditingIterator::Next((EditingIterator *)&bucket_1), bVar4) {
        _src1ValNum = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                      Iterator::Data((Iterator *)&bucket_1);
        src2ValNum = *(ValueNumber *)&_src1ValNum->value;
        VVar6 = ExprHash::GetSrc1ValueNumber((ExprHash *)&src2ValNum);
        VVar7 = ExprHash::GetSrc2ValueNumber((ExprHash *)&src2ValNum);
        if (((VVar6 == 0) ||
            (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                               ((BVSparse<Memory::JitArenaAllocator> *)&upwardExposedUses,VVar6),
            BVar5 != '\0')) &&
           ((VVar7 == 0 ||
            (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                               ((BVSparse<Memory::JitArenaAllocator> *)&upwardExposedUses,VVar7),
            BVar5 != '\0')))) {
          bVar4 = true;
          pVVar1 = _src1ValNum->element;
          if (pVVar1 != (Value *)0x0) {
            pVVar11 = ::Value::GetValueInfo(pVVar1);
            pSVar14 = ValueInfo::GetSymStore(pVVar11);
            if ((pSVar14 != (Sym *)0x0) &&
               (this_02 = GlobOptBlockData::FindValue(&this->globOptData,pSVar14),
               this_02 != (Value *)0x0)) {
              VVar6 = ::Value::GetValueNumber(this_02);
              VVar7 = ::Value::GetValueNumber(pVVar1);
              if (VVar6 == VVar7) {
                bVar4 = false;
                BVSparse<Memory::JitArenaAllocator>::Clear
                          ((BVSparse<Memory::JitArenaAllocator> *)
                           &keepAliveSymsBv.lastUsedNodePrevNextField,pSVar14->m_id);
                bVar15 = Sym::IsStackSym(pSVar14);
                if (bVar15) {
                  pSVar13 = Sym::AsStackSym(pSVar14);
                  bVar15 = StackSym::HasObjectTypeSym(pSVar13);
                  if (bVar15) {
                    pSVar13 = Sym::AsStackSym(pSVar14);
                    pSVar13 = StackSym::GetObjectTypeSym(pSVar13);
                    BVSparse<Memory::JitArenaAllocator>::Clear
                              ((BVSparse<Memory::JitArenaAllocator> *)
                               &keepAliveSymsBv.lastUsedNodePrevNextField,(pSVar13->super_Sym).m_id)
                    ;
                  }
                }
              }
            }
          }
        }
        else {
          bVar4 = true;
        }
        if (bVar4) {
          SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
          EditingIterator::RemoveCurrent
                    ((EditingIterator *)&bucket_1,&pEVar2->alloc->super_ArenaAllocator);
        }
        else {
          (this->globOptData).hasCSECandidates = (bool)(iter_1.last._7_1_ & 1);
        }
      }
    }
    for (__startIndex = (BVSparseNode<Memory::JitArenaAllocator> *)
                        keepAliveSymsBv.lastUsedNodePrevNextField;
        __startIndex != (BVSparseNode<Memory::JitArenaAllocator> *)0x0;
        __startIndex = __startIndex->next) {
      _unit.word._0_4_ = __startIndex->startIndex;
      sym_2 = *(Sym **)&__startIndex->data;
      _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&sym_2);
      while (_unit.word._4_4_ != 0xffffffff) {
        key = (int)_unit.word + _unit.word._4_4_;
        BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&sym_2,_unit.word._4_4_);
        ValueHashTable<Sym_*,_Value_*>::Clear(this_00,key);
        tempBv.lastUsedNodePrevNextField = (Type)SymTable::Find(this->func->m_symTable,key);
        GlobOptBlockData::SetChangedSym(&this->globOptData,(Sym *)tempBv.lastUsedNodePrevNextField);
        _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&sym_2);
      }
      if (__startIndex == (BVSparseNode<Memory::JitArenaAllocator> *)0x0) break;
    }
    bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                      ((BVSparse<Memory::JitArenaAllocator> *)
                       &keepAliveSymsBv.lastUsedNodePrevNextField);
    if (!bVar4) {
      bVar4 = Func::IsJitInDebugMode(this->func);
      if (bVar4) {
        if (this->func->m_nonTempLocalVars == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x1133,"(this->func->m_nonTempLocalVars)",
                             "this->func->m_nonTempLocalVars");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        BVSparse<Memory::JitArenaAllocator>::BVSparse
                  ((BVSparse<Memory::JitArenaAllocator> *)local_210,allocator);
        BVSparse<Memory::JitArenaAllocator>::Minus
                  ((BVSparse<Memory::JitArenaAllocator> *)local_210,
                   (BVSparse<Memory::JitArenaAllocator> *)&keepAliveSymsBv.lastUsedNodePrevNextField
                   ,this->func->m_nonTempLocalVars);
        BVSparse<Memory::JitArenaAllocator>::Minus
                  ((this->globOptData).liveVarSyms,(BVSparse<Memory::JitArenaAllocator> *)local_210)
        ;
        BVSparse<Memory::JitArenaAllocator>::And
                  ((BVSparse<Memory::JitArenaAllocator> *)local_210,
                   (this->globOptData).liveInt32Syms,this->func->m_nonTempLocalVars);
        bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                          ((BVSparse<Memory::JitArenaAllocator> *)local_210);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x1139,"(tempBv.IsEmpty())",
                             "Type spec is disabled under debugger. How come did we get a non-temp local in liveInt32Syms?"
                            );
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        BVSparse<Memory::JitArenaAllocator>::And
                  ((BVSparse<Memory::JitArenaAllocator> *)local_210,
                   (this->globOptData).liveLossyInt32Syms,this->func->m_nonTempLocalVars);
        bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                          ((BVSparse<Memory::JitArenaAllocator> *)local_210);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x113b,"(tempBv.IsEmpty())",
                             "Type spec is disabled under debugger. How come did we get a non-temp local in liveLossyInt32Syms?"
                            );
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        BVSparse<Memory::JitArenaAllocator>::And
                  ((BVSparse<Memory::JitArenaAllocator> *)local_210,
                   (this->globOptData).liveFloat64Syms,this->func->m_nonTempLocalVars);
        bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                          ((BVSparse<Memory::JitArenaAllocator> *)local_210);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x113d,"(tempBv.IsEmpty())",
                             "Type spec is disabled under debugger. How come did we get a non-temp local in liveFloat64Syms?"
                            );
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        BVSparse<Memory::JitArenaAllocator>::~BVSparse
                  ((BVSparse<Memory::JitArenaAllocator> *)local_210);
      }
      else {
        BVSparse<Memory::JitArenaAllocator>::Minus
                  ((this->globOptData).liveVarSyms,
                   (BVSparse<Memory::JitArenaAllocator> *)&keepAliveSymsBv.lastUsedNodePrevNextField
                  );
      }
      BVSparse<Memory::JitArenaAllocator>::Minus
                ((this->globOptData).liveInt32Syms,
                 (BVSparse<Memory::JitArenaAllocator> *)&keepAliveSymsBv.lastUsedNodePrevNextField);
      BVSparse<Memory::JitArenaAllocator>::Minus
                ((this->globOptData).liveLossyInt32Syms,
                 (BVSparse<Memory::JitArenaAllocator> *)&keepAliveSymsBv.lastUsedNodePrevNextField);
      BVSparse<Memory::JitArenaAllocator>::Minus
                ((this->globOptData).liveFloat64Syms,
                 (BVSparse<Memory::JitArenaAllocator> *)&keepAliveSymsBv.lastUsedNodePrevNextField);
    }
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (((this->globOptData).globOpt)->alloc,obj);
    this->upwardExposedUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (((this->globOptData).globOpt)->alloc,obj_00);
    this->upwardExposedFields = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    if (this->cloneStrCandidates != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (((this->globOptData).globOpt)->alloc,this->cloneStrCandidates);
      this->cloneStrCandidates = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    }
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)&callSequence);
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)&upwardExposedUses);
    BVSparse<Memory::JitArenaAllocator>::~BVSparse((BVSparse<Memory::JitArenaAllocator> *)local_78);
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)&keepAliveSymsBv.lastUsedNodePrevNextField);
  }
  return;
}

Assistant:

void
BasicBlock::CleanUpValueMaps()
{
    // Don't do cleanup if it's been done recently.
    // Landing pad could get optimized twice...
    // We want the same info out the first and second time. So always cleanup.
    // Increasing the cleanup threshold count for asmjs to 500
    uint cleanupCount = (!this->globOptData.globOpt->GetIsAsmJSFunc()) ? CONFIG_FLAG(GoptCleanupThreshold) : CONFIG_FLAG(AsmGoptCleanupThreshold);
    if (!this->IsLandingPad() && this->globOptData.globOpt->instrCountSinceLastCleanUp < cleanupCount)
    {
        return;
    }
    this->globOptData.globOpt->instrCountSinceLastCleanUp = 0;

    JitArenaAllocator* tempAlloc = this->globOptData.globOpt->tempAlloc;

    GlobHashTable *thisTable = this->globOptData.symToValueMap;
    BVSparse<JitArenaAllocator> deadSymsBv(tempAlloc);
    BVSparse<JitArenaAllocator> keepAliveSymsBv(tempAlloc);
    BVSparse<JitArenaAllocator> availableValueNumbers(tempAlloc);
    availableValueNumbers.Copy(this->globOptData.globOpt->byteCodeConstantValueNumbersBv);
    BVSparse<JitArenaAllocator> *upwardExposedUses = this->upwardExposedUses;
    BVSparse<JitArenaAllocator> *upwardExposedFields = this->upwardExposedFields;
    bool isInLoop = !!this->loop;

    BVSparse<JitArenaAllocator> symsInCallSequence(tempAlloc);
    SListBase<IR::Opnd *> * callSequence = this->globOptData.callSequence;
    if (callSequence && !callSequence->Empty())
    {
        FOREACH_SLISTBASE_ENTRY(IR::Opnd *, opnd, callSequence)
        {
            StackSym * sym = opnd->GetStackSym();
            symsInCallSequence.Set(sym->m_id);
        }
    }
    NEXT_SLISTBASE_ENTRY;

    for (uint i = 0; i < thisTable->tableSize; i++)
    {
        FOREACH_SLISTBASE_ENTRY_EDITING(GlobHashBucket, bucket, &thisTable->table[i], iter)
        {
            Sym * sym = bucket.value;
            bool isSymUpwardExposed = upwardExposedUses->Test(sym->m_id) || upwardExposedFields->Test(sym->m_id);
            if (!isSymUpwardExposed && symsInCallSequence.Test(sym->m_id))
            {
                // Don't remove/shrink sym-value pair if the sym is referenced in callSequence even if the sym is dead according to backward data flow.
                // This is possible in some edge cases that an infinite loop is involved when evaluating parameter for a function (between StartCall and Call),
                // there is no backward data flow into the infinite loop block, but non empty callSequence still populates to it in this (forward) pass
                // which causes error when looking up value for the syms in callSequence (cannot find the value).
                // It would cause error to fill out the bailout information for the loop blocks.
                // Remove dead syms from callSequence has some risk because there are various associated counters which need to be consistent.
                continue;
            }
            // Make sure symbol was created before backward pass.
            // If symbols isn't upward exposed, mark it as dead.
            // If a symbol was copy-prop'd in a loop prepass, the upwardExposedUses info could be wrong.  So wait until we are out of the loop before clearing it.
            bool isSymFieldPRESymStore = isInLoop && this->loop->fieldPRESymStores->Test(sym->m_id);
            if ((SymID)sym->m_id <= this->globOptData.globOpt->maxInitialSymID && !isSymUpwardExposed && !isSymFieldPRESymStore
                && (!isInLoop || !this->globOptData.globOpt->prePassCopyPropSym->Test(sym->m_id)))
            {
                Value *val = bucket.element;
                ValueInfo *valueInfo = val->GetValueInfo();

                Sym *symStore = valueInfo->GetSymStore();

                if (symStore && symStore == sym)
                {
                    // Keep constants around, as we don't know if there will be further uses
                    if (!bucket.element->GetValueInfo()->IsVarConstant() && !bucket.element->GetValueInfo()->HasIntConstantValue())
                    {
                        // Symbol may still be a copy-prop candidate.  Wait before deleting it.
                        deadSymsBv.Set(sym->m_id);

                        // Make sure the type sym is added to the dead syms vector as well, because type syms are
                        // created in backward pass and so their symIds > maxInitialSymID.
                        if (sym->IsStackSym() && sym->AsStackSym()->HasObjectTypeSym())
                        {
                            deadSymsBv.Set(sym->AsStackSym()->GetObjectTypeSym()->m_id);
                        }
                    }
                    availableValueNumbers.Set(val->GetValueNumber());
                }
                else
                {
                    // Make sure the type sym is added to the dead syms vector as well, because type syms are
                    // created in backward pass and so their symIds > maxInitialSymID. Perhaps we could remove
                    // it explicitly here, but would it work alright with the iterator?
                    if (sym->IsStackSym() && sym->AsStackSym()->HasObjectTypeSym())
                    {
                        deadSymsBv.Set(sym->AsStackSym()->GetObjectTypeSym()->m_id);
                    }

                    // Not a copy-prop candidate; delete it right away.
                    iter.RemoveCurrent(thisTable->alloc);
                    this->globOptData.liveInt32Syms->Clear(sym->m_id);
                    this->globOptData.liveLossyInt32Syms->Clear(sym->m_id);
                    this->globOptData.liveFloat64Syms->Clear(sym->m_id);
                    this->globOptData.SetChangedSym(sym);
                }
            }
            else
            {
                if (sym->IsPropertySym() && !this->globOptData.liveFields->Test(sym->m_id))
                {
                    // Remove propertySyms which are not live anymore.
                    iter.RemoveCurrent(thisTable->alloc);
                    this->globOptData.liveInt32Syms->Clear(sym->m_id);
                    this->globOptData.liveLossyInt32Syms->Clear(sym->m_id);
                    this->globOptData.liveFloat64Syms->Clear(sym->m_id);
                }
                else
                {
                    // Look at the copy-prop candidate. We don't want to get rid of the data for a symbol which is
                    // a copy-prop candidate.
                    Value *val = bucket.element;
                    ValueInfo *valueInfo = val->GetValueInfo();

                    Sym *symStore = valueInfo->GetSymStore();

                    if (symStore && symStore != sym)
                    {
                        keepAliveSymsBv.Set(symStore->m_id);
                        if (symStore->IsStackSym() && symStore->AsStackSym()->HasObjectTypeSym())
                        {
                            keepAliveSymsBv.Set(symStore->AsStackSym()->GetObjectTypeSym()->m_id);
                        }
                    }
                    availableValueNumbers.Set(val->GetValueNumber());
                }
            }
        } NEXT_SLISTBASE_ENTRY_EDITING;
    }

    deadSymsBv.Minus(&keepAliveSymsBv);

    // Now cleanup exprToValueMap table
    ExprHashTable *thisExprTable = this->globOptData.exprToValueMap;
    bool oldHasCSECandidatesValue = this->globOptData.hasCSECandidates;  // Could be false if none need bailout.
    this->globOptData.hasCSECandidates = false;

    for (uint i = 0; i < thisExprTable->tableSize; i++)
    {
        FOREACH_SLISTBASE_ENTRY_EDITING(ExprHashBucket, bucket, &thisExprTable->table[i], iter)
        {
            ExprHash hash = bucket.value;
            ValueNumber src1ValNum = hash.GetSrc1ValueNumber();
            ValueNumber src2ValNum = hash.GetSrc2ValueNumber();

            // If src1Val or src2Val are not available anymore, no point keeping this CSE candidate
            bool removeCurrent = false;
            if ((src1ValNum && !availableValueNumbers.Test(src1ValNum))
                || (src2ValNum && !availableValueNumbers.Test(src2ValNum)))
            {
                removeCurrent = true;
            }
            else
            {
                // If we are keeping this value, make sure we also keep the symStore in the value table
                removeCurrent = true; // Remove by default, unless it's set to false later below.
                Value *val = bucket.element;
                if (val)
                {
                    Sym *symStore = val->GetValueInfo()->GetSymStore();
                    if (symStore)
                    {
                        Value *symStoreVal = this->globOptData.FindValue(symStore);

                        if (symStoreVal && symStoreVal->GetValueNumber() == val->GetValueNumber())
                        {
                            removeCurrent = false;
                            deadSymsBv.Clear(symStore->m_id);
                            if (symStore->IsStackSym() && symStore->AsStackSym()->HasObjectTypeSym())
                            {
                                deadSymsBv.Clear(symStore->AsStackSym()->GetObjectTypeSym()->m_id);
                            }
                        }
                    }
                }
            }

            if(removeCurrent)
            {
                iter.RemoveCurrent(thisExprTable->alloc);
            }
            else
            {
                this->globOptData.hasCSECandidates = oldHasCSECandidatesValue;
            }
        } NEXT_SLISTBASE_ENTRY_EDITING;
    }

    FOREACH_BITSET_IN_SPARSEBV(dead_id, &deadSymsBv)
    {
        thisTable->Clear(dead_id);
        Sym* sym = this->func->m_symTable->Find(dead_id);
        this->globOptData.SetChangedSym(sym);
    }
    NEXT_BITSET_IN_SPARSEBV;

    if (!deadSymsBv.IsEmpty())
    {
        if (this->func->IsJitInDebugMode())
        {
            // Do not remove non-temp local vars from liveVarSyms (i.e. do not let them become dead).
            // We will need to restore all initialized/used so far non-temp local during bail out.
            // (See BackwardPass::ProcessBailOutInfo)
            Assert(this->func->m_nonTempLocalVars);
            BVSparse<JitArenaAllocator> tempBv(tempAlloc);
            tempBv.Minus(&deadSymsBv, this->func->m_nonTempLocalVars);
            this->globOptData.liveVarSyms->Minus(&tempBv);
#if DBG
            tempBv.And(this->globOptData.liveInt32Syms, this->func->m_nonTempLocalVars);
            AssertMsg(tempBv.IsEmpty(), "Type spec is disabled under debugger. How come did we get a non-temp local in liveInt32Syms?");
            tempBv.And(this->globOptData.liveLossyInt32Syms, this->func->m_nonTempLocalVars);
            AssertMsg(tempBv.IsEmpty(), "Type spec is disabled under debugger. How come did we get a non-temp local in liveLossyInt32Syms?");
            tempBv.And(this->globOptData.liveFloat64Syms, this->func->m_nonTempLocalVars);
            AssertMsg(tempBv.IsEmpty(), "Type spec is disabled under debugger. How come did we get a non-temp local in liveFloat64Syms?");
#endif
        }
        else
        {
            this->globOptData.liveVarSyms->Minus(&deadSymsBv);
        }

        this->globOptData.liveInt32Syms->Minus(&deadSymsBv);
        this->globOptData.liveLossyInt32Syms->Minus(&deadSymsBv);
        this->globOptData.liveFloat64Syms->Minus(&deadSymsBv);
    }

    JitAdelete(this->globOptData.globOpt->alloc, upwardExposedUses);
    this->upwardExposedUses = nullptr;
    JitAdelete(this->globOptData.globOpt->alloc, upwardExposedFields);
    this->upwardExposedFields = nullptr;
    if (this->cloneStrCandidates)
    {
        JitAdelete(this->globOptData.globOpt->alloc, this->cloneStrCandidates);
        this->cloneStrCandidates = nullptr;
    }
}